

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_svm.cc
# Opt level: O2

size_t suboptimality(svm_model *model,double *subopt)

{
  svm_example *psVar1;
  size_t sVar2;
  size_t i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  float fVar6;
  float fVar7;
  
  dVar4 = 0.0;
  uVar3 = 0;
  sVar2 = 0;
  do {
    if (model->num_support <= uVar3) {
      return sVar2;
    }
    psVar1 = (model->support_vec)._begin[uVar3];
    fVar6 = (model->alpha)._begin[uVar3] * (psVar1->ex).l.simple.label;
    if (((psVar1->ex).l.simple.weight <= fVar6) ||
       (fVar7 = (model->delta)._begin[uVar3], 0.0 <= fVar7)) {
      dVar5 = 0.0;
      if ((0.0 < fVar6) && (fVar7 = (model->delta)._begin[uVar3], dVar5 = 0.0, 0.0 < fVar7))
      goto LAB_001ba869;
    }
    else {
LAB_001ba869:
      dVar5 = (double)ABS(fVar7);
    }
    if (dVar4 < dVar5) {
      sVar2 = uVar3;
    }
    subopt[uVar3] = dVar5;
    if (dVar5 <= dVar4) {
      dVar5 = dVar4;
    }
    dVar4 = dVar5;
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

size_t suboptimality(svm_model* model, double* subopt)
{
  size_t max_pos = 0;
  // cerr<<"Subopt ";
  double max_val = 0;
  for (size_t i = 0; i < model->num_support; i++)
  {
    float tmp = model->alpha[i] * model->support_vec[i]->ex.l.simple.label;

    if ((tmp < model->support_vec[i]->ex.l.simple.weight && model->delta[i] < 0) || (tmp > 0 && model->delta[i] > 0))
      subopt[i] = fabs(model->delta[i]);
    else
      subopt[i] = 0;

    if (subopt[i] > max_val)
    {
      max_val = subopt[i];
      max_pos = i;
    }
    // cerr<<subopt[i]<<" ";
  }
  // cerr<<endl;
  return max_pos;
}